

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool absl::numbers_internal::safe_strtou64_base(string_view text,Nonnull<uint64_t_*> value,int base)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *in_R9;
  ulong uVar14;
  byte *pbVar15;
  
  pbVar12 = (byte *)text._M_str;
  pbVar13 = (byte *)text._M_len;
  *value = 0;
  bVar6 = true;
  if (pbVar12 == (byte *)0x0) goto LAB_00271b4a;
  pbVar8 = pbVar12;
  if (0 < (long)pbVar13) {
    do {
      if (((&ascii_internal::kPropertyBits)[*pbVar8] & 8) == 0) break;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 < pbVar12 + (long)pbVar13);
  }
  pbVar15 = pbVar12 + 1;
  in_R9 = pbVar12;
  do {
    if (in_R9 + (long)pbVar13 <= pbVar8) goto LAB_00271b4a;
    pbVar1 = in_R9 + -1;
    pbVar15 = pbVar15 + -1;
    in_R9 = in_R9 + -1;
  } while (((&ascii_internal::kPropertyBits)[pbVar1[(long)pbVar13]] & 8) != 0);
  bVar2 = *pbVar8;
  pbVar1 = in_R9 + (long)pbVar13;
  in_R9 = (byte *)(ulong)(bVar2 == 0x2d);
  if (((bVar2 == 0x2d) || (bVar2 == 0x2b)) && (pbVar8 = pbVar8 + 1, pbVar1 + 1 <= pbVar8))
  goto LAB_00271b4a;
  if (base == 0x10) {
    uVar9 = 0x10;
    if (((1 < (long)(pbVar15 + ((long)pbVar13 - (long)pbVar8))) && (*pbVar8 == 0x30)) &&
       ((pbVar8[1] | 0x20) == 0x78)) {
LAB_00271c18:
      pbVar8 = pbVar8 + 2;
      uVar9 = 0x10;
      if (pbVar1 + 1 <= pbVar8) goto LAB_00271b4a;
    }
  }
  else if (base == 0) {
    if (((1 < (long)(pbVar15 + ((long)pbVar13 - (long)pbVar8))) && (*pbVar8 == 0x30)) &&
       ((pbVar8[1] | 0x20) == 0x78)) goto LAB_00271c18;
    if ((long)(pbVar15 + ((long)pbVar13 - (long)pbVar8)) < 1) {
      uVar9 = 10;
    }
    else {
      bVar2 = *pbVar8;
      pbVar8 = pbVar8 + (bVar2 == 0x30);
      uVar9 = (uint)(bVar2 != 0x30) * 2 + 8;
    }
  }
  else {
    uVar9 = base;
    if (0x22 < base - 2U) goto LAB_00271b4a;
  }
  base = uVar9;
  pbVar13 = pbVar15 + ((long)pbVar13 - (long)pbVar8);
  bVar6 = false;
  pbVar12 = pbVar8;
LAB_00271b4a:
  if (((ulong)in_R9 & 1) == 0 && !bVar6) {
    if (base < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3da,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                   );
    }
    uVar14 = CONCAT44(0,base);
    uVar3 = *(ulong *)((anonymous_namespace)::LookupTables<unsigned_long>::kVmaxOverBase +
                      uVar14 * 8);
    if ((1 < base) &&
       (auVar4._8_8_ = 0, auVar4._0_8_ = uVar14,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar4,0) != uVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3df,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                   );
    }
    bVar6 = (long)pbVar13 < 1;
    if ((long)pbVar13 < 1) {
      uVar11 = 0;
    }
    else {
      pbVar13 = pbVar13 + (long)pbVar12;
      uVar7 = 0;
      do {
        uVar10 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[*pbVar12];
        if (uVar10 < uVar14) {
          if (uVar3 < uVar7) {
LAB_00271bba:
            *value = 0xffffffffffffffff;
            uVar11 = uVar7;
            goto LAB_00271bc6;
          }
          uVar7 = uVar7 * uVar14;
          uVar11 = uVar10 + uVar7;
          if (CARRY8(uVar10,uVar7)) goto LAB_00271bba;
          bVar5 = true;
        }
        else {
          *value = uVar7;
          uVar11 = uVar7;
LAB_00271bc6:
          bVar5 = false;
        }
        if (!bVar5) {
          return bVar6;
        }
        pbVar12 = pbVar12 + 1;
        bVar6 = pbVar12 >= pbVar13;
        uVar7 = uVar11;
      } while (pbVar12 < pbVar13);
    }
    *value = uVar11;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool safe_strtou64_base(absl::string_view text, absl::Nonnull<uint64_t*> value,
                        int base) {
  return safe_uint_internal<uint64_t>(text, value, base);
}